

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void codeDeferredSeek(WhereInfo *pWInfo,Index *pIdx,int iCur,int iIdxCur)

{
  ushort uVar1;
  i16 iCol;
  Parse *pPVar2;
  Vdbe *p;
  Table *pTab;
  i16 *piVar3;
  i16 iVar4;
  Parse *pPVar5;
  int *zP4;
  ulong uVar6;
  
  pPVar2 = pWInfo->pParse;
  p = pPVar2->pVdbe;
  pWInfo->field_0x44 = pWInfo->field_0x44 | 1;
  sqlite3VdbeAddOp3(p,0x8d,iIdxCur,0,iCur);
  if ((pWInfo->wctrlFlags & 0x1020) != 0) {
    pPVar5 = pPVar2->pToplevel;
    if (pPVar2->pToplevel == (Parse *)0x0) {
      pPVar5 = pPVar2;
    }
    if (pPVar5->writeMask == 0) {
      pTab = pIdx->pTable;
      zP4 = (int *)sqlite3DbMallocZero(pPVar2->db,(long)pTab->nCol * 4 + 4);
      if (zP4 != (int *)0x0) {
        *zP4 = (int)pTab->nCol;
        uVar1 = pIdx->nColumn;
        if (1 < uVar1) {
          piVar3 = pIdx->aiColumn;
          uVar6 = 0;
          do {
            iCol = piVar3[uVar6];
            iVar4 = sqlite3TableColumnToStorage(pTab,iCol);
            if (-1 < iCol) {
              zP4[(long)iVar4 + 1] = (int)uVar6 + 1;
            }
            uVar6 = uVar6 + 1;
          } while (uVar1 - 1 != uVar6);
        }
        sqlite3VdbeChangeP4(p,-1,(char *)zP4,-0xe);
        return;
      }
    }
  }
  return;
}

Assistant:

static void codeDeferredSeek(
  WhereInfo *pWInfo,              /* Where clause context */
  Index *pIdx,                    /* Index scan is using */
  int iCur,                       /* Cursor for IPK b-tree */
  int iIdxCur                     /* Index cursor */
){
  Parse *pParse = pWInfo->pParse; /* Parse context */
  Vdbe *v = pParse->pVdbe;        /* Vdbe to generate code within */

  assert( iIdxCur>0 );
  assert( pIdx->aiColumn[pIdx->nColumn-1]==-1 );

  pWInfo->bDeferredSeek = 1;
  sqlite3VdbeAddOp3(v, OP_DeferredSeek, iIdxCur, 0, iCur);
  if( (pWInfo->wctrlFlags & (WHERE_OR_SUBCLAUSE|WHERE_RIGHT_JOIN))
   && DbMaskAllZero(sqlite3ParseToplevel(pParse)->writeMask)
  ){
    int i;
    Table *pTab = pIdx->pTable;
    u32 *ai = (u32*)sqlite3DbMallocZero(pParse->db, sizeof(u32)*(pTab->nCol+1));
    if( ai ){
      ai[0] = pTab->nCol;
      for(i=0; i<pIdx->nColumn-1; i++){
        int x1, x2;
        assert( pIdx->aiColumn[i]<pTab->nCol );
        x1 = pIdx->aiColumn[i];
        x2 = sqlite3TableColumnToStorage(pTab, x1);
        testcase( x1!=x2 );
        if( x1>=0 ) ai[x2+1] = i+1;
      }
      sqlite3VdbeChangeP4(v, -1, (char*)ai, P4_INTARRAY);
    }
  }
}